

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service.hpp
# Opt level: O0

void __thiscall
asio::detail::reactive_socket_service<asio::ip::tcp>::reactive_socket_service
          (reactive_socket_service<asio::ip::tcp> *this,io_context *io_context)

{
  io_context *io_context_local;
  reactive_socket_service<asio::ip::tcp> *this_local;
  
  service_base<asio::detail::reactive_socket_service<asio::ip::tcp>_>::service_base
            (&this->super_service_base<asio::detail::reactive_socket_service<asio::ip::tcp>_>,
             io_context);
  reactive_socket_service_base::reactive_socket_service_base
            (&this->super_reactive_socket_service_base,io_context);
  (this->super_service_base<asio::detail::reactive_socket_service<asio::ip::tcp>_>).super_service.
  super_service._vptr_service = (_func_int **)&PTR__reactive_socket_service_00230950;
  return;
}

Assistant:

reactive_socket_service(asio::io_context& io_context)
    : service_base<reactive_socket_service<Protocol> >(io_context),
      reactive_socket_service_base(io_context)
  {
  }